

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::SSATransformFixVisitor::visit(SSATransformFixVisitor *this,Generator *gen)

{
  bool bVar1;
  StatementType SVar2;
  StatementBlockType SVar3;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *__x;
  element_type *peVar4;
  element_type *this_00;
  bool local_99;
  undefined1 local_98 [8];
  shared_ptr<kratos::StmtBlock> blk_stmt;
  allocator<char> local_71;
  string local_70;
  __shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_50;
  shared_ptr<kratos::Stmt> *stmt;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *__range2;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  Generator *gen_local;
  SSATransformFixVisitor *this_local;
  
  stmts.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)gen;
  __x = Generator::get_all_stmts(gen);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
         &__range2,__x);
  __end2 = std::
           vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
           begin((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  *)&__range2);
  stmt = (shared_ptr<kratos::Stmt> *)
         std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
         ::end((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                     *)&stmt), bVar1) {
    local_50 = (__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
               ::operator*(&__end2);
    peVar4 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_50);
    SVar2 = Stmt::type(peVar4);
    blk_stmt.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _3_1_ = 0;
    local_99 = false;
    if (SVar2 == Block) {
      peVar4 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"ssa",&local_71);
      blk_stmt.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _3_1_ = 1;
      local_99 = IRNode::has_attribute(&peVar4->super_IRNode,&local_70);
    }
    if ((blk_stmt.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_70);
    }
    if (SVar2 == Block) {
      std::allocator<char>::~allocator(&local_71);
    }
    if (local_99 != false) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (local_50);
      Stmt::as<kratos::StmtBlock>((Stmt *)local_98);
      this_00 = std::
                __shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_98);
      SVar3 = StmtBlock::block_type(this_00);
      if (SVar3 == Combinational) {
        process_always_comb((shared_ptr<kratos::StmtBlock> *)local_98);
      }
      std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)local_98);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end2);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          &__range2);
  return;
}

Assistant:

void visit(Generator *gen) override {
        auto stmts = gen->get_all_stmts();
        for (auto const &stmt : stmts) {
            if (stmt->type() == StatementType::Block && stmt->has_attribute("ssa")) {
                auto blk_stmt = stmt->as<StmtBlock>();
                if (blk_stmt->block_type() == StatementBlockType::Combinational) {
                    process_always_comb(blk_stmt);
                }
            }
        }
    }